

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

basic_byte_string<std::allocator<unsigned_char>_> * __thiscall
jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
as_byte_string<std::allocator<unsigned_char>>
          (basic_byte_string<std::allocator<unsigned_char>_> *__return_storage_ptr__,
          basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *this)

{
  uchar *__first;
  semantic_tag tag;
  ser_error *this_00;
  json_runtime_error<std::domain_error,_void> *this_01;
  error_code ec_00;
  value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_void>
  converter;
  error_code ec;
  string local_38;
  
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  switch((byte)*this & 0xf) {
  case 7:
  case 0xf:
    local_38._0_16_ =
         basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::as_string_view
                   ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                    this);
    tag = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::tag
                    ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     this);
    value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_void>
    ::convert<char>(__return_storage_ptr__,&converter,
                    (basic_string_view<char,_std::char_traits<char>_> *)&local_38,tag,&ec);
    if (ec._M_value != 0) {
      this_00 = (ser_error *)__cxa_allocate_exception(0x58);
      ec_00._4_4_ = 0;
      ec_00._M_value = ec._M_value;
      ec_00._M_cat = ec._M_cat;
      ser_error::ser_error(this_00,ec_00);
      __cxa_throw(this_00,&ser_error::typeinfo,ser_error::~ser_error);
    }
    break;
  case 8:
  case 9:
    as_byte_string<std::allocator<unsigned_char>>
              (__return_storage_ptr__,
               *(basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> **)
                (this + 8));
    break;
  default:
    this_01 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Not a byte string",(allocator<char> *)&converter);
    json_runtime_error<std::domain_error,_void>::json_runtime_error(this_01,&local_38);
    __cxa_throw(this_01,&json_runtime_error<std::domain_error,void>::typeinfo,
                json_runtime_error<std::domain_error,_void>::~json_runtime_error);
  case 0xc:
    __first = *(uchar **)(*(long *)(this + 8) + 0x10);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,__first
               ,__first + *(long *)(*(long *)(this + 8) + 0x18),(allocator_type *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

basic_byte_string<BAllocator> as_byte_string() const
        {
            using byte_string_type = basic_byte_string<BAllocator>;
            std::error_code ec;

            switch (storage_kind())
            {
                case json_storage_kind::short_str:
                case json_storage_kind::long_str:
                {
                    value_converter<jsoncons::string_view, byte_string_type> converter;
                    byte_string_type v = converter.convert(as_string_view(),tag(), ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        JSONCONS_THROW(ser_error(ec));
                    }
                    return v;
                }
                case json_storage_kind::byte_str:
                    return basic_byte_string<BAllocator>(cast<byte_string_storage>().data(),cast<byte_string_storage>().length());
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().as_byte_string();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().as_byte_string();
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Not a byte string"));
            }
        }